

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

void VP8LBackwardRefsClear(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *ptr;
  PixOrCopyBlock *pPVar1;
  
  if (refs->tail != (PixOrCopyBlock **)0x0) {
    *refs->tail = refs->free_blocks;
  }
  ptr = refs->refs;
  refs->free_blocks = ptr;
  refs->tail = &refs->refs;
  refs->last_block = (PixOrCopyBlock *)0x0;
  refs->refs = (PixOrCopyBlock *)0x0;
  while (ptr != (PixOrCopyBlock *)0x0) {
    pPVar1 = ptr->next;
    WebPSafeFree(ptr);
    refs->free_blocks = pPVar1;
    ptr = pPVar1;
  }
  return;
}

Assistant:

void VP8LBackwardRefsClear(VP8LBackwardRefs* const refs) {
  assert(refs != NULL);
  VP8LClearBackwardRefs(refs);
  while (refs->free_blocks != NULL) {
    PixOrCopyBlock* const next = refs->free_blocks->next;
    WebPSafeFree(refs->free_blocks);
    refs->free_blocks = next;
  }
}